

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall PrintVisitor::visit(PrintVisitor *this,FunctionResultCallNode *node)

{
  bool bVar1;
  ostream *poVar2;
  ExpressionNode *pEVar3;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *this_00;
  element_type *peVar4;
  long *in_RSI;
  PrintVisitor *in_RDI;
  shared_ptr<ExpressionNode> *arg;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *__range1
  ;
  PrintVisitor visitor;
  undefined8 in_stack_ffffffffffffff00;
  uint indentation;
  ostream *in_stack_ffffffffffffff08;
  PrintVisitor *in_stack_ffffffffffffff10;
  _Self local_b0;
  _Self local_a8;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *local_a0
  ;
  string local_98 [32];
  string local_78 [32];
  undefined1 local_58 [40];
  string local_30 [32];
  long *local_10;
  
  indentation = (uint)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  poVar2 = in_RDI->stream_;
  local_10 = in_RSI;
  indent_abi_cxx11_(in_RDI);
  poVar2 = std::operator<<(poVar2,local_30);
  std::operator<<(poVar2,"FunctionResultCallNode:\n");
  std::__cxx11::string::~string(local_30);
  PrintVisitor(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,indentation);
  poVar2 = in_RDI->stream_;
  indent_abi_cxx11_(in_RDI);
  poVar2 = std::operator<<(poVar2,local_78);
  std::operator<<(poVar2,"Function:\n");
  std::__cxx11::string::~string(local_78);
  pEVar3 = FunctionResultCallNode::getCall((FunctionResultCallNode *)0x168313);
  (*(pEVar3->super_Node)._vptr_Node[2])(pEVar3,local_58);
  poVar2 = in_RDI->stream_;
  indent_abi_cxx11_(in_RDI);
  poVar2 = std::operator<<(poVar2,local_98);
  std::operator<<(poVar2,"Arguments:\n");
  std::__cxx11::string::~string(local_98);
  this_00 = (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
             *)(**(code **)(*local_10 + 0x18))();
  local_a0 = this_00;
  local_a8._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
       begin(this_00);
  local_b0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::end
                 (this_00);
  while( true ) {
    bVar1 = std::operator!=(&local_a8,&local_b0);
    if (!bVar1) break;
    std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator*
              ((_List_const_iterator<std::shared_ptr<ExpressionNode>_> *)poVar2);
    peVar4 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1683ee);
    (*(peVar4->super_Node)._vptr_Node[2])(peVar4,local_58);
    std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator++(&local_a8);
  }
  ~PrintVisitor((PrintVisitor *)0x16849b);
  return;
}

Assistant:

void PrintVisitor::visit(const FunctionResultCallNode& node)
{
  stream_ << indent() << "FunctionResultCallNode:\n";

  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  stream_ << indent() << "Function:\n";
  node.getCall().accept(visitor);
  
  stream_ << indent() << "Arguments:\n";
  for(const auto& arg : node.getArguments())
  {
    arg->accept(visitor);
  }
}